

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Render.cpp
# Opt level: O1

void render_scene(Scene *scene,double half_width,double half_height,int nx,int ny,char *fname)

{
  undefined1 auVar1 [16];
  double x;
  int iVar2;
  TargaImage *this;
  int iVar3;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  Ray ray;
  double local_c8;
  undefined8 uStack_b0;
  Color local_90;
  double local_78;
  undefined8 uStack_70;
  Ray local_60;
  
  auVar1._8_4_ = in_XMM0_Dc;
  auVar1._0_8_ = half_width;
  auVar1._12_4_ = in_XMM0_Dd;
  this = (TargaImage *)operator_new(0x40);
  TargaImage::TargaImage(this,fname,nx,ny,(char *)0x0);
  if (0 < ny) {
    uStack_b0 = auVar1._8_8_;
    local_78 = (half_width + half_width) / (double)nx;
    uStack_70 = uStack_b0;
    iVar2 = 0;
    local_c8 = half_height;
    do {
      iVar3 = nx;
      x = -half_width;
      if (0 < nx) {
        do {
          TotalPixels = TotalPixels + 1;
          Scene::camera(scene,x,local_c8,&local_60);
          Scene::trace(&local_90,scene,&Grayzer::Medium::air,1.0,&local_60);
          (*(this->super_Image)._vptr_Image[3])
                    (this,(ulong)((int)(local_90.x * 255.0) & 0xffU |
                                 ((int)(local_90.y * 255.0) & 0xffU) << 8 |
                                 (int)(local_90.z * 255.0) << 0x10));
          iVar3 = iVar3 + -1;
          x = x + local_78;
        } while (iVar3 != 0);
      }
      iVar2 = iVar2 + 1;
      local_c8 = local_c8 - (half_height + half_height) / (double)ny;
    } while (iVar2 != ny);
  }
  (*(this->super_Image)._vptr_Image[1])(this);
  return;
}

Assistant:

void render_scene(Scene* scene, double half_width, double half_height,
               int nx, int ny,
               char const* fname)
{
   double x, y;
   double hx = 2.0   * half_width  /   nx;
   double hy = 2.0   * half_height /   ny;
   Ray   ray;
   Vector color;
   int   i, j;

   auto tga = std::make_unique<TargaImage>( fname, nx, ny );
   rgb   c;

/* $NB$ what is it? where it from?  how   it got here?

   left unused: does much unnecessary work   (I think so),
            produces very funny  TGA   files (pixels intermixed)
   for(int  yfactor  = 16; yfactor >   0; yfactor--)
      for(int  xfactor  = 16; xfactor >   0; xfactor--)
         for(i=0,y=HalfHeight;i<ny;i+=yfactor,y-=hy*yfactor)
         {
            for(j=0,x=-HalfWidth;j<nx;j+=xfactor,x+=hx*xfactor)
*/
   for( i = 0, y =   half_height; i < ny; i++, y   -= hy )
   {
      for( j = 0, x =   -half_width; j < nx; j++, x   += hx )
      {
         TotalPixels++;

         scene->camera(x, y, ray);

         color = scene->trace( Grayzer::Medium::air, 1.0, ray );
         clip( color );

         c.r   = color.x * 255;
         c.g   = color.y * 255;
         c.b   = color.z * 255;

         tga->put_pixel(c);
      }
   }
}